

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTableColumnIdx IVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ImGuiTableColumnIdx *pIVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  iVar1 = table->ColumnsCount;
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 1) {
    IVar3 = '\0';
  }
  else {
    pIVar2 = (table->Columns).Data;
    lVar6 = uVar7 * 0x68;
    lVar10 = 0;
    uVar4 = 0;
    uVar8 = 0;
    do {
      bVar5 = (&pIVar2->SortOrder)[lVar10];
      if (bVar5 == 0xff) {
LAB_00154f9c:
        bVar5 = 0xff;
      }
      else if ((&pIVar2->IsEnabled)[lVar10] == false) {
        (&pIVar2->SortOrder)[lVar10] = -1;
        goto LAB_00154f9c;
      }
      uVar13 = 1L << (bVar5 & 0x3f);
      if (bVar5 == 0xff) {
        uVar13 = 0;
      }
      uVar8 = uVar8 | uVar13;
      uVar4 = uVar4 + (bVar5 != 0xff);
      lVar10 = lVar10 + 0x68;
    } while (lVar6 - lVar10 != 0);
    if (uVar4 < 2) {
      bVar14 = false;
    }
    else {
      bVar14 = (table->Flags & 0x4000000) == 0;
    }
    if (uVar4 != 0 && !(bool)((bVar14 ^ 1U) & 1L << ((byte)uVar4 & 0x3f) == uVar8 + 1)) {
      pIVar2 = (table->Columns).Data;
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (iVar1 < 1) {
          pIVar2[-1].SortOrder = (ImGuiTableColumnIdx)uVar9;
          uVar13 = 0xffffffff;
          if (bVar14) goto LAB_00155102;
        }
        else {
          uVar12 = 0xffffffff;
          uVar13 = 0;
          pIVar11 = &pIVar2->SortOrder;
          do {
            if ((((uVar8 >> (uVar13 & 0x3f) & 1) == 0) && (*pIVar11 != -1)) &&
               ((uVar12 == 0xffffffff || (*pIVar11 < pIVar2[(int)uVar12].SortOrder)))) {
              uVar12 = (uint)uVar13;
            }
            uVar13 = uVar13 + 1;
            pIVar11 = pIVar11 + 0x68;
          } while (uVar7 != uVar13);
          uVar13 = (ulong)uVar12;
          pIVar2[(int)uVar12].SortOrder = (ImGuiTableColumnIdx)uVar9;
          if (bVar14) {
            uVar4 = 1;
            if (0 < iVar1) {
              lVar10 = 0;
              do {
                if (uVar13 * 0x68 - lVar10 != 0) {
                  (&pIVar2->SortOrder)[lVar10] = -1;
                }
                lVar10 = lVar10 + 0x68;
              } while (lVar6 - lVar10 != 0);
            }
            goto LAB_00155107;
          }
        }
        uVar8 = uVar8 | 1L << (uVar13 & 0x3f);
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar4);
    }
    if (uVar4 == 0) {
      if ((table->Flags & 0x8000000) == 0 && 0 < iVar1) {
        pIVar2 = (table->Columns).Data;
        lVar10 = 0;
LAB_001550a5:
        if (((&pIVar2->IsEnabled)[lVar10] != true) ||
           ((*(byte *)((long)&pIVar2->Flags + lVar10 + 1) & 2) != 0)) goto LAB_001550b3;
        (&pIVar2->SortOrder)[lVar10] = '\0';
        (&pIVar2->field_0x65)[lVar10] =
             (&pIVar2->field_0x65)[lVar10] & 0xfc | (&pIVar2->SortDirectionsAvailList)[lVar10] & 3;
LAB_00155102:
        uVar4 = 1;
        goto LAB_00155107;
      }
LAB_001550bc:
      uVar4 = 0;
    }
LAB_00155107:
    IVar3 = (ImGuiTableColumnIdx)uVar4;
  }
  table->SortSpecsCount = IVar3;
  return;
LAB_001550b3:
  lVar10 = lVar10 + 0x68;
  if (lVar6 - lVar10 == 0) goto LAB_001550bc;
  goto LAB_001550a5;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}